

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

Vec_Ptr_t * Llb_ManCutMap(Aig_Man_t *p,Vec_Ptr_t *vResult,Vec_Ptr_t *vSupps)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Ptr_t *p_00;
  Vec_Ptr_t *pVVar4;
  Vec_Int_t *pVVar5;
  void *__ptr;
  void *__ptr_00;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pObj_00;
  void *pvVar7;
  Vec_Int_t *p_01;
  Vec_Int_t *local_128;
  uint local_84;
  int local_80;
  int Counter;
  int CounterMinus;
  int CounterPlus;
  int k;
  int i;
  int *piLast;
  int *piFirst;
  Aig_Obj_t *pObj;
  Vec_Int_t *vNext;
  Vec_Int_t *vPrev;
  Vec_Int_t *vMap;
  Vec_Ptr_t *vOne;
  Vec_Ptr_t *vMaps;
  int fShowMatrix;
  Vec_Ptr_t *vSupps_local;
  Vec_Ptr_t *vResult_local;
  Aig_Man_t *p_local;
  
  p_00 = Vec_PtrAlloc(100);
  for (CounterPlus = 0; iVar1 = Vec_PtrSize(vResult), CounterPlus < iVar1;
      CounterPlus = CounterPlus + 1) {
    pVVar4 = (Vec_Ptr_t *)Vec_PtrEntry(vResult,CounterPlus);
    iVar1 = Aig_ManObjNumMax(p);
    pVVar5 = Vec_IntStart(iVar1);
    for (CounterMinus = 0; iVar1 = Vec_PtrSize(pVVar4), CounterMinus < iVar1;
        CounterMinus = CounterMinus + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pVVar4,CounterMinus);
      iVar1 = Saig_ObjIsPi(p,pAVar6);
      if (iVar1 == 0) {
        Vec_IntWriteEntry(pVVar5,pAVar6->Id,1);
      }
    }
    Vec_PtrPush(p_00,pVVar5);
  }
  iVar1 = Aig_ManObjNumMax(p);
  pVVar5 = Vec_IntStart(iVar1);
  Vec_PtrPush(p_00,pVVar5);
  iVar1 = Vec_PtrSize(p_00);
  iVar2 = Vec_PtrSize(vResult);
  if (iVar1 != iVar2 + 1) {
    __assert_fail("Vec_PtrSize(vMaps) == Vec_PtrSize(vResult)+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb2Flow.c"
                  ,0x72,"Vec_Ptr_t *Llb_ManCutMap(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  iVar1 = Saig_ManPiNum(p);
  __ptr = malloc((long)iVar1 << 2);
  iVar1 = Saig_ManPiNum(p);
  __ptr_00 = malloc((long)iVar1 << 2);
  for (CounterPlus = 0; iVar1 = Saig_ManPiNum(p), CounterPlus < iVar1; CounterPlus = CounterPlus + 1
      ) {
    Vec_PtrEntry(p->vCis,CounterPlus);
    *(undefined4 *)((long)__ptr_00 + (long)CounterPlus * 4) = 0xffffffff;
    *(undefined4 *)((long)__ptr + (long)CounterPlus * 4) = 0xffffffff;
  }
  for (CounterPlus = 0; iVar1 = Vec_PtrSize(vSupps), CounterPlus < iVar1;
      CounterPlus = CounterPlus + 1) {
    pVVar4 = (Vec_Ptr_t *)Vec_PtrEntry(vSupps,CounterPlus);
    for (CounterMinus = 0; iVar1 = Vec_PtrSize(pVVar4), CounterMinus < iVar1;
        CounterMinus = CounterMinus + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pVVar4,CounterMinus);
      iVar1 = Saig_ObjIsPi(p,pAVar6);
      if (iVar1 != 0) {
        iVar1 = Aig_ObjCioId(pAVar6);
        if (*(int *)((long)__ptr + (long)iVar1 * 4) == -1) {
          iVar1 = Aig_ObjCioId(pAVar6);
          *(int *)((long)__ptr + (long)iVar1 * 4) = CounterPlus;
        }
        iVar1 = Aig_ObjCioId(pAVar6);
        *(int *)((long)__ptr_00 + (long)iVar1 * 4) = CounterPlus;
      }
    }
  }
  for (CounterPlus = 0; iVar1 = Saig_ManRegNum(p), CounterPlus < iVar1;
      CounterPlus = CounterPlus + 1) {
    pVVar4 = p->vCos;
    iVar1 = Saig_ManPoNum(p);
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pVVar4,CounterPlus + iVar1);
    pObj_00 = Aig_ObjFanin0(pAVar6);
    iVar1 = Saig_ObjIsPi(p,pObj_00);
    if (iVar1 != 0) {
      iVar1 = Vec_PtrSize(p_00);
      pAVar6 = Aig_ObjFanin0(pAVar6);
      iVar2 = Aig_ObjCioId(pAVar6);
      *(int *)((long)__ptr_00 + (long)iVar2 * 4) = iVar1 + -1;
    }
  }
  for (CounterPlus = 0; iVar1 = Saig_ManPiNum(p), CounterPlus < iVar1; CounterPlus = CounterPlus + 1
      ) {
    pvVar7 = Vec_PtrEntry(p->vCis,CounterPlus);
    if (*(int *)((long)__ptr + (long)CounterPlus * 4) != -1) {
      if (*(int *)((long)__ptr + (long)CounterPlus * 4) ==
          *(int *)((long)__ptr_00 + (long)CounterPlus * 4)) {
        pVVar5 = (Vec_Int_t *)Vec_PtrEntry(p_00,*(int *)((long)__ptr + (long)CounterPlus * 4));
        Vec_IntWriteEntry(pVVar5,*(int *)((long)pvVar7 + 0x24),2);
      }
      else {
        for (CounterMinus = *(int *)((long)__ptr + (long)CounterPlus * 4);
            CounterMinus <= *(int *)((long)__ptr_00 + (long)CounterPlus * 4);
            CounterMinus = CounterMinus + 1) {
          pVVar5 = (Vec_Int_t *)Vec_PtrEntry(p_00,CounterMinus);
          Vec_IntWriteEntry(pVVar5,*(int *)((long)pvVar7 + 0x24),1);
        }
      }
    }
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
  }
  local_84 = Aig_ManRegNum(p);
  printf("%d ",(ulong)local_84);
  for (CounterPlus = 1; iVar1 = Vec_PtrSize(p_00), CounterPlus < iVar1;
      CounterPlus = CounterPlus + 1) {
    pVVar5 = (Vec_Int_t *)Vec_PtrEntry(p_00,CounterPlus);
    p_01 = (Vec_Int_t *)Vec_PtrEntry(p_00,CounterPlus + -1);
    iVar1 = Vec_PtrSize(p_00);
    if (CounterPlus == iVar1 + -1) {
      local_128 = (Vec_Int_t *)0x0;
    }
    else {
      local_128 = (Vec_Int_t *)Vec_PtrEntry(p_00,CounterPlus + 1);
    }
    local_80 = 0;
    Counter = 0;
    for (CounterMinus = 0; iVar1 = Vec_PtrSize(p->vObjs), CounterMinus < iVar1;
        CounterMinus = CounterMinus + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,CounterMinus);
      if (pAVar6 != (Aig_Obj_t *)0x0) {
        iVar1 = Saig_ObjIsPi(p,pAVar6);
        if (iVar1 == 0) {
          iVar1 = Vec_IntEntry(p_01,CounterMinus);
          if ((iVar1 == 0) && (iVar1 = Vec_IntEntry(pVVar5,CounterMinus), iVar1 == 1)) {
            Counter = Counter + 1;
          }
          iVar1 = Vec_IntEntry(p_01,CounterMinus);
          if ((iVar1 == 1) && (iVar1 = Vec_IntEntry(pVVar5,CounterMinus), iVar1 == 0)) {
            local_80 = local_80 + 1;
          }
        }
        else {
          iVar1 = Vec_IntEntry(p_01,CounterMinus);
          if ((iVar1 == 0) && (iVar1 = Vec_IntEntry(pVVar5,CounterMinus), iVar1 == 1)) {
            Counter = Counter + 1;
          }
          iVar1 = Vec_IntEntry(pVVar5,CounterMinus);
          if ((iVar1 == 1) &&
             ((local_128 == (Vec_Int_t *)0x0 ||
              (iVar1 = Vec_IntEntry(local_128,CounterMinus), iVar1 == 0)))) {
            local_80 = local_80 + 1;
          }
        }
      }
    }
    local_84 = (local_84 + Counter) - local_80;
    printf("%d=%d ",(ulong)(uint)CounterPlus,(ulong)local_84);
  }
  printf("\n");
  CounterPlus = 0;
  do {
    iVar1 = Vec_PtrSize(p->vObjs);
    if (iVar1 <= CounterPlus) {
      return p_00;
    }
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,CounterPlus);
    if ((pAVar6 != (Aig_Obj_t *)0x0) &&
       ((iVar1 = Aig_ObjIsCi(pAVar6), iVar1 != 0 || (iVar1 = Aig_ObjIsNode(pAVar6), iVar1 != 0)))) {
      for (CounterMinus = 0; iVar1 = Vec_PtrSize(p_00), CounterMinus < iVar1;
          CounterMinus = CounterMinus + 1) {
        pVVar5 = (Vec_Int_t *)Vec_PtrEntry(p_00,CounterMinus);
        iVar1 = Vec_IntEntry(pVVar5,CounterPlus);
        if (iVar1 != 0) break;
      }
      iVar1 = Vec_PtrSize(p_00);
      if (CounterMinus != iVar1) {
        printf("Obj = %4d : ",(ulong)(uint)CounterPlus);
        iVar1 = Saig_ObjIsPi(p,pAVar6);
        if (iVar1 == 0) {
          iVar1 = Saig_ObjIsLo(p,pAVar6);
          if (iVar1 == 0) {
            iVar1 = Aig_ObjIsNode(pAVar6);
            if (iVar1 != 0) {
              printf("and ");
            }
          }
          else {
            printf("lo  ");
          }
        }
        else {
          printf("pi  ");
        }
        for (CounterMinus = 0; iVar1 = Vec_PtrSize(p_00), CounterMinus < iVar1;
            CounterMinus = CounterMinus + 1) {
          pVVar5 = (Vec_Int_t *)Vec_PtrEntry(p_00,CounterMinus);
          uVar3 = Vec_IntEntry(pVVar5,CounterPlus);
          printf("%d",(ulong)uVar3);
        }
        printf("\n");
      }
    }
    CounterPlus = CounterPlus + 1;
  } while( true );
}

Assistant:

Vec_Ptr_t * Llb_ManCutMap( Aig_Man_t * p, Vec_Ptr_t * vResult, Vec_Ptr_t * vSupps )
{
    int fShowMatrix = 1;
    Vec_Ptr_t * vMaps, * vOne;
    Vec_Int_t * vMap, * vPrev, * vNext;
    Aig_Obj_t * pObj;
    int * piFirst, * piLast;
    int i, k, CounterPlus, CounterMinus, Counter;

    vMaps = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Vec_Ptr_t *, vResult, vOne, i )
    {
        vMap = Vec_IntStart( Aig_ManObjNumMax(p) );
        Vec_PtrForEachEntry( Aig_Obj_t *, vOne, pObj, k )
        {
            if ( !Saig_ObjIsPi(p, pObj) )
                Vec_IntWriteEntry( vMap, pObj->Id, 1 );
//            else
//printf( "*" );
//printf( "%d ", pObj->Id );
        }
        Vec_PtrPush( vMaps, vMap );
//printf( "\n" );
    }
    Vec_PtrPush( vMaps, Vec_IntStart( Aig_ManObjNumMax(p) ) );
    assert( Vec_PtrSize(vMaps) == Vec_PtrSize(vResult)+1 );

    // collect the first and last PIs
    piFirst = ABC_ALLOC( int, Saig_ManPiNum(p) );
    piLast  = ABC_ALLOC( int, Saig_ManPiNum(p) );
    Saig_ManForEachPi( p, pObj, i )
        piFirst[i] = piLast[i] = -1;
    Vec_PtrForEachEntry( Vec_Ptr_t *, vSupps, vOne, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vOne, pObj, k )
        {
            if ( !Saig_ObjIsPi(p, pObj) )
                continue;
            if ( piFirst[Aig_ObjCioId(pObj)] == -1 )
                 piFirst[Aig_ObjCioId(pObj)] = i;
            piLast[Aig_ObjCioId(pObj)] = i;
        }
    }
    // PIs feeding into the flops should be extended to the last frame
    Saig_ManForEachLi( p, pObj, i )
    {
        if ( !Saig_ObjIsPi(p, Aig_ObjFanin0(pObj)) )
            continue;
        piLast[Aig_ObjCioId(Aig_ObjFanin0(pObj))] = Vec_PtrSize(vMaps)-1;
    }

    // set the PI map
    Saig_ManForEachPi( p, pObj, i )
    {
        if ( piFirst[i] == -1 )
            continue;
        if ( piFirst[i] == piLast[i] )
        {
            vMap = (Vec_Int_t *)Vec_PtrEntry( vMaps, piFirst[i] );
            Vec_IntWriteEntry( vMap, pObj->Id, 2 );
            continue;
        }

        // set support for all in between        
        for ( k = piFirst[i]; k <= piLast[i]; k++ )
        {
            vMap = (Vec_Int_t *)Vec_PtrEntry( vMaps, k );
            Vec_IntWriteEntry( vMap, pObj->Id, 1 );
        }
    }
    ABC_FREE( piFirst );
    ABC_FREE( piLast );


    // find all that will appear here
    Counter = Aig_ManRegNum(p);
    printf( "%d ", Counter );
    Vec_PtrForEachEntryStart( Vec_Int_t *, vMaps, vMap, i, 1 )
    {
        vPrev = (Vec_Int_t *)Vec_PtrEntry( vMaps, i-1 );
        vNext = (i == Vec_PtrSize(vMaps)-1)? NULL: (Vec_Int_t *)Vec_PtrEntry( vMaps, i+1 );

        CounterPlus = CounterMinus = 0;
        Aig_ManForEachObj( p, pObj, k )
        {
            if ( Saig_ObjIsPi(p, pObj) )
            {
                if ( Vec_IntEntry(vPrev, k) == 0 && Vec_IntEntry(vMap, k) == 1 )
                    CounterPlus++;
                if ( Vec_IntEntry(vMap, k) == 1 && (vNext == NULL || Vec_IntEntry(vNext, k) == 0) )
                    CounterMinus++;
            }
            else
            {
                if ( Vec_IntEntry(vPrev, k) == 0 && Vec_IntEntry(vMap, k) == 1 )
                    CounterPlus++;
                if ( Vec_IntEntry(vPrev, k) == 1 && Vec_IntEntry(vMap, k) == 0 )
                    CounterMinus++;
            }
        }
        Counter = Counter + CounterPlus - CounterMinus;
        printf( "%d=%d ", i, Counter );
    }
    printf( "\n" );

    if ( !fShowMatrix )
        return vMaps;
    Aig_ManForEachObj( p, pObj, i )
    {
        if ( !Aig_ObjIsCi(pObj) && !Aig_ObjIsNode(pObj) )
            continue;
        Vec_PtrForEachEntry( Vec_Int_t *, vMaps, vMap, k )
            if ( Vec_IntEntry(vMap, i) )
                break;
        if ( k == Vec_PtrSize(vMaps) )
            continue;
        printf( "Obj = %4d : ", i );
        if ( Saig_ObjIsPi(p,pObj) )
            printf( "pi  " );
        else if ( Saig_ObjIsLo(p,pObj) )
            printf( "lo  " );
        else if ( Aig_ObjIsNode(pObj) )
            printf( "and " );

        Vec_PtrForEachEntry( Vec_Int_t *, vMaps, vMap, k )
            printf( "%d", Vec_IntEntry(vMap, i) );
        printf( "\n" );
    }
    return vMaps;
}